

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

void av1_loop_filter_init(AV1_COMMON *cm)

{
  long in_RDI;
  int lvl;
  loopfilter *lf;
  loop_filter_info_n *lfi;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  
  update_sharpness((loop_filter_info_n *)
                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
  for (iVar1 = 0; iVar1 < 0x40; iVar1 = iVar1 + 1) {
    memset((void *)(in_RDI + (long)iVar1 * 0x30 + 0x4b10),iVar1 >> 4 & 0xff,0x10);
  }
  return;
}

Assistant:

void av1_loop_filter_init(AV1_COMMON *cm) {
  assert(MB_MODE_COUNT == NELEMENTS(mode_lf_lut));
  loop_filter_info_n *lfi = &cm->lf_info;
  struct loopfilter *lf = &cm->lf;
  int lvl;

  // init limits for given sharpness
  update_sharpness(lfi, lf->sharpness_level);

  // init hev threshold const vectors
  for (lvl = 0; lvl <= MAX_LOOP_FILTER; lvl++)
    memset(lfi->lfthr[lvl].hev_thr, (lvl >> 4), SIMD_WIDTH);
}